

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O3

int decode_jpeg_header(jpeg *z,int scan)

{
  FILE *__stream;
  uint8 uVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  
  z->marker = 0xff;
  uVar1 = get_marker(z);
  if (uVar1 == 0xd8) {
    iVar3 = 1;
    if (scan != 1) {
      bVar2 = get_marker(z);
      while( true ) {
        uVar4 = (uint)bVar2;
        if ((uVar4 & 0xfffffffe) == 0xc0) {
          iVar3 = process_frame_header(z,uVar4);
          return iVar3;
        }
        iVar3 = process_marker(z,uVar4);
        if (iVar3 == 0) break;
        while (bVar2 = get_marker(z), bVar2 == 0xff) {
          __stream = (FILE *)(z->s).img_file;
          if (__stream == (FILE *)0x0) {
            uVar4 = (uint)((z->s).img_buffer_end <= (z->s).img_buffer);
          }
          else {
            uVar4 = feof(__stream);
          }
          if (uVar4 != 0) {
            failure_reason = "Corrupt JPEG";
            return 0;
          }
        }
      }
      return 0;
    }
  }
  else {
    failure_reason = "Corrupt JPEG";
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int decode_jpeg_header(jpeg *z, int scan)
{
   int m;
   z->marker = MARKER_none; // initialize cached marker to empty
   m = get_marker(z);
   if (!SOI(m)) return e("no SOI","Corrupt JPEG");
   if (scan == SCAN_type) return 1;
   m = get_marker(z);
   while (!SOF(m)) {
      if (!process_marker(z,m)) return 0;
      m = get_marker(z);
      while (m == MARKER_none) {
         // some files have extra padding after their blocks, so ok, we'll scan
         if (at_eof(&z->s)) return e("no SOF", "Corrupt JPEG");
         m = get_marker(z);
      }
   }
   if (!process_frame_header(z, scan)) return 0;
   return 1;
}